

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall ELFIO::elfio::load(elfio *this,string *file_name)

{
  bool bVar1;
  ifstream stream;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    std::__cxx11::string::_M_assign((string *)&this->name);
    bVar1 = load(this,(istream *)local_220);
  }
  else {
    bVar1 = false;
  }
  std::ifstream::~ifstream(local_220);
  return bVar1;
}

Assistant:

bool load( const std::string& file_name )
    {
        std::ifstream stream;
        stream.open( file_name.c_str(), std::ios::in | std::ios::binary );
        if ( !stream ) {
            return false;
        }

		this->name = file_name;
        return load(stream);
    }